

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_main.cpp
# Opt level: O2

void swrenderer::Cmd_r_visibility(FCommandLine *argv,APlayerPawn *who,int key)

{
  int iVar1;
  char *__nptr;
  double vis;
  
  iVar1 = FCommandLine::argc(argv);
  if (iVar1 < 2) {
    Printf("Visibility is %g\n",CurrentVisibility);
    return;
  }
  if (netgame != false) {
    Printf("Visibility cannot be changed in net games.\n");
    return;
  }
  __nptr = FCommandLine::operator[](argv,1);
  vis = atof(__nptr);
  R_SetVisibility(vis);
  return;
}

Assistant:

CCMD (r_visibility)
{
	if (argv.argc() < 2)
	{
		Printf ("Visibility is %g\n", R_GetVisibility());
	}
	else if (!netgame)
	{
		R_SetVisibility(atof(argv[1]));
	}
	else
	{
		Printf ("Visibility cannot be changed in net games.\n");
	}
}